

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O2

Pipeline * __thiscall
n_e_s::core::Mos6502::create_zeropage_addressing_steps
          (Pipeline *__return_storage_ptr__,Mos6502 *this,MemoryAccess access)

{
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  Pipeline::Pipeline(__return_storage_ptr__);
  local_40._M_unused._M_object = this;
  if (access < ReadWrite) {
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1154:21)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1154:21)>
               ::_M_manager;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_40);
  }
  else {
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1159:21)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1159:21)>
               ::_M_manager;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_40);
    std::_Function_base::~_Function_base((_Function_base *)&local_40);
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1163:21)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1163:21)>
               ::_M_manager;
    local_40._M_unused._M_object = this;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_40);
    std::_Function_base::~_Function_base((_Function_base *)&local_40);
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1164:21)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:1164:21)>
               ::_M_manager;
    local_40._M_unused._M_object = this;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_40);
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_zeropage_addressing_steps(MemoryAccess access) {
    Pipeline result;
    if (access == MemoryAccess::Read || access == MemoryAccess::Write) {
        result.push([this] {
            effective_address_ = mmu_->read_byte(registers_->pc);
            ++registers_->pc;
        });
    } else {
        result.push([this] {
            effective_address_ = mmu_->read_byte(registers_->pc);
            ++registers_->pc;
        });
        result.push([this] { tmp_ = mmu_->read_byte(effective_address_); });
        result.push([this] {
            // Extra write with the old value
            mmu_->write_byte(effective_address_, tmp_);
        });
    }
    return result;
}